

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_send_websocket_handshake(mg_connection *nc,char *uri,char *extra_headers)

{
  char *local_68;
  char local_48 [8];
  char key [24];
  char *local_28;
  unsigned_long random;
  char *extra_headers_local;
  char *uri_local;
  mg_connection *nc_local;
  
  local_28 = uri;
  random = (unsigned_long)extra_headers;
  extra_headers_local = uri;
  uri_local = (char *)nc;
  mg_base64_encode((uchar *)&local_28,8,local_48);
  if (random == 0) {
    local_68 = "";
  }
  else {
    local_68 = (char *)random;
  }
  mg_printf((mg_connection *)uri_local,
            "GET %s HTTP/1.1\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Key: %s\r\n%s\r\n"
            ,extra_headers_local,local_48,local_68);
  return;
}

Assistant:

void mg_send_websocket_handshake(struct mg_connection *nc, const char *uri,
                                 const char *extra_headers) {
    unsigned long random = (unsigned long) uri;
    char key[sizeof(random) * 3];

    mg_base64_encode((unsigned char *) &random, sizeof(random), key);
    mg_printf(nc,
              "GET %s HTTP/1.1\r\n"
                      "Upgrade: websocket\r\n"
                      "Connection: Upgrade\r\n"
                      "Sec-WebSocket-Version: 13\r\n"
                      "Sec-WebSocket-Key: %s\r\n"
                      "%s\r\n",
              uri, key, extra_headers == NULL ? "" : extra_headers);
}